

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Parser * GetParserForNode(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  Lexer *pLVar2;
  Parser *pPVar3;
  
  if (*(int *)((doc->config).value + 0x67) != 0) {
    return ParseXMLElement;
  }
  if ((node != (Node *)0x0) && (pDVar1 = node->tag, pDVar1 != (Dict *)0x0)) {
    pLVar2 = doc->lexer;
    if ((pDVar1->model & 1) == 0) {
      if ((pDVar1->model & 0x10) == 0) {
        pLVar2->insertspace = no;
      }
    }
    else {
      pLVar2->waswhite = no;
      if (pDVar1->parser == (Parser *)0x0) {
        return (Parser *)0x0;
      }
    }
    pPVar3 = pDVar1->parser;
    if ((pPVar3 != (Parser *)0x0) && (node->type != StartEndTag)) {
      pLVar2->parent = node;
      return pPVar3;
    }
  }
  return (Parser *)0x0;
}

Assistant:

static Parser* GetParserForNode( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    if ( cfgBool( doc, TidyXmlTags ) )
        return ParseXMLElement;
    
    /* [i_a]2 prevent crash for active content (php, asp) docs */
    if (!node || node->tag == NULL)
        return NULL;

    /*
       Fix by GLP 2000-12-21.  Need to reset insertspace if this is both
       a non-inline and empty tag (base, link, meta, isindex, hr, area).
    */
    if (node->tag->model & CM_EMPTY)
    {
        lexer->waswhite = no;
        if (node->tag->parser == NULL)
            return NULL;
    }
    else if (!(node->tag->model & CM_INLINE))
        lexer->insertspace = no;

    if (node->tag->parser == NULL)
        return NULL;

    if (node->type == StartEndTag)
        return NULL;

    /* [i_a]2 added this - not sure why - CHECKME: */
    lexer->parent = node;

    return (node->tag->parser);
}